

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void ParseStructLabel(CStructure *st)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char temp [2048];
  
  pcVar4 = temp;
  if (PreviousIsLabel != (char *)0x0) {
    free(PreviousIsLabel);
    PreviousIsLabel = (char *)0x0;
  }
  bVar1 = White();
  if (!bVar1) {
    pcVar3 = temp;
    if (*lp != '.') goto LAB_0011e983;
    while( true ) {
      lp = lp + 1;
      pcVar3 = pcVar4;
LAB_0011e983:
      if (*lp == '\0') break;
      iVar2 = islabchar(*lp);
      if (iVar2 == 0) break;
      *pcVar3 = *lp;
      pcVar4 = pcVar3 + 1;
    }
    *pcVar3 = '\0';
    if (*lp == ':') {
      lp = lp + 1;
    }
    SkipBlanks();
    if ((byte)temp[0] - 0x30 < 10) {
      Error("[STRUCT] Number labels not allowed within structs",(char *)0x0,PASS3);
      return;
    }
    PreviousIsLabel = strdup(temp);
    if (PreviousIsLabel == (char *)0x0) {
      ErrorOOM();
    }
    CStructure::AddLabel(st,temp);
  }
  return;
}

Assistant:

void ParseStructLabel(CStructure* st) {
	char* tp, temp[LINEMAX];
	if (PreviousIsLabel) {
		free(PreviousIsLabel);
		PreviousIsLabel = nullptr;
	}
	if (White()) {
		return;
	}
	tp = temp;
	if (*lp == '.') {
		++lp;
	}
	while (*lp && islabchar(*lp)) {
		*tp = *lp; ++tp; ++lp;
	}
	*tp = 0;
	if (*lp == ':') {
		++lp;
	}
	tp = temp; SkipBlanks();
	if (isdigit((byte)*tp)) {
		Error("[STRUCT] Number labels not allowed within structs"); return;
	}
	PreviousIsLabel = STRDUP(tp);
	if (PreviousIsLabel == NULL) ErrorOOM();
	st->AddLabel(tp);
}